

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form4_Merge(MergeForm4 Merge)

{
  uint8_t uVar1;
  bool bVar2;
  pair<unsigned_int,_unsigned_int> *ppVar3;
  pair<unsigned_int,_unsigned_int> pVar4;
  pointer puVar5;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  undefined1 local_d8 [16];
  pair<unsigned_int,_unsigned_int> *local_c8;
  MergeForm4 local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  
  local_b0 = Merge;
  Unit_Test::intensityArray(&intensity,3);
  input.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar5 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar5;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)local_d8,0,0,'\x01','\x01');
      Test_Helper::uniformImage(&output,uVar1,0,0,(ImageTemplate<unsigned_char> *)local_d8);
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
      ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
                ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                  *)&input,&output);
      output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
      local_d8._0_8_ = &PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_d8);
      puVar5 = puVar5 + 1;
    } while (puVar5 != intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  uVar1 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_d8,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&output,uVar1,(Image *)local_d8);
  local_d8._0_8_ = &PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_d8);
  ppVar3 = (pair<unsigned_int,_unsigned_int> *)operator_new(0x20);
  local_d8._8_8_ = ppVar3 + 4;
  ppVar3->first = 0;
  ppVar3->second = 0;
  ppVar3[1].first = 0;
  ppVar3[1].second = 0;
  ppVar3[2].first = 0;
  ppVar3[2].second = 0;
  ppVar3[3].first = 0;
  ppVar3[3].second = 0;
  local_d8._0_8_ = ppVar3;
  local_c8 = (pair<unsigned_int,_unsigned_int> *)local_d8._8_8_;
  pVar4 = Unit_Test::imageSize
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  *ppVar3 = pVar4;
  pVar4 = Unit_Test::imageSize
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  ppVar3[1] = pVar4;
  pVar4 = Unit_Test::imageSize
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
  ppVar3[2] = pVar4;
  pVar4 = Unit_Test::imageSize(&output);
  ppVar3[3] = pVar4;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi
            ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_d8,&roiX,&roiY,&roiWidth,&roiHeight);
  (*local_b0)(input.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
              *roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
              *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
              input.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1,
              roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[1],
              roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[1],
              input.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2,
              roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[2],
              roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[2],&output,
              roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[3],
              roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[3],roiWidth,roiHeight);
  bVar2 = Unit_Test::verifyImage
                    (&output,roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[3],
                     roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[3],roiWidth,roiHeight,&intensity,false);
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pair<unsigned_int,_unsigned_int> *)local_d8._0_8_ != (pair<unsigned_int,_unsigned_int> *)0x0)
  {
    operator_delete((void *)local_d8._0_8_);
  }
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form4_Merge(MergeForm4 Merge)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > input;
        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        PenguinV_Image::Image output = uniformRGBImage( intensityValue() );

        std::vector < std::pair <uint32_t, uint32_t> > size( 4 );
        size[0] = imageSize( input[0] );
        size[1] = imageSize( input[1] );
        size[2] = imageSize( input[2] );
        size[3] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        Merge( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], input[2], roiX[2], roiY[2], output, roiX[3], roiY[3], roiWidth, roiHeight );

        return verifyImage( output, roiX[3], roiY[3], roiWidth, roiHeight, intensity, false );
    }